

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sha1.cpp
# Opt level: O0

ON_SHA1_Hash *
ON_SHA1_Hash::FileSystemPathHash
          (ON_SHA1_Hash *__return_storage_ptr__,wchar_t *path,bool bIgnoreCase)

{
  ON__UINT64 local_48;
  ON__UINT64 byte_count;
  ON_wString local_30;
  ON_wString local_28;
  ON_wString clean_path;
  ON_StringMapOrdinalType string_map;
  wchar_t directory_separator;
  bool bDeleteWindowsUNCHostNameOrDiskLetter;
  bool bAllowWindowsUNCHostNameOrDiskLetter;
  bool bTrimRight;
  bool bTrimLeft;
  bool bIgnoreCase_local;
  wchar_t *path_local;
  
  clean_path.m_s._4_4_ = 0x2f;
  clean_path.m_s._0_4_ = (bIgnoreCase & 1) * 3;
  ON_FileSystemPath::CleanPath(SUB81(&local_30,0),false,false,true,L'\0',(wchar_t *)0x2f);
  ON_wString::MapStringOrdinal(&local_28,(ON_StringMapOrdinalType)&local_30);
  ON_wString::~ON_wString(&local_30);
  local_48 = 0;
  StringHash(__return_storage_ptr__,&local_28,&local_48);
  ON_wString::~ON_wString(&local_28);
  return __return_storage_ptr__;
}

Assistant:

ON_SHA1_Hash ON_SHA1_Hash::FileSystemPathHash(
  const wchar_t* path,
  bool bIgnoreCase
  )
{
  const bool bTrimLeft = false;
  const bool bTrimRight = false;
  const bool bAllowWindowsUNCHostNameOrDiskLetter = true;
  const bool bDeleteWindowsUNCHostNameOrDiskLetter = false;
  const wchar_t directory_separator = ON_wString::Slash;
  const ON_StringMapOrdinalType string_map
    = bIgnoreCase
    ? ON_StringMapOrdinalType::MinimumOrdinal
    : ON_StringMapOrdinalType::Identity;

  const ON_wString clean_path = ON_FileSystemPath::CleanPath(
    bTrimLeft,
    bTrimRight,
    bAllowWindowsUNCHostNameOrDiskLetter,
    bDeleteWindowsUNCHostNameOrDiskLetter,
    directory_separator,
    path
    ).MapStringOrdinal(string_map);

  ON__UINT64 byte_count = 0;
  return ON_SHA1_Hash::StringHash( clean_path, byte_count );
}